

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

Parser * __thiscall cli::Parser::howto_required_abi_cxx11_(Parser *this,CmdBase *command)

{
  ostream *poVar1;
  long in_RDX;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  long local_20;
  CmdBase *command_local;
  Parser *this_local;
  
  local_20 = in_RDX;
  command_local = command;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"The parameter ");
  poVar1 = std::operator<<(poVar1,(string *)(local_20 + 8));
  std::operator<<(poVar1," is required.\n");
  poVar1 = std::operator<<(local_198,(string *)(local_20 + 0x68));
  std::operator<<(poVar1,'\n');
  print_help((Parser *)command,(stringstream *)local_1a8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string howto_required(CmdBase* command) const {
			std::stringstream ss { };
			ss << "The parameter " << command->name << " is required.\n";
			ss << command->description << '\n';
			print_help(ss);
			return ss.str();
		}